

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Program p;
  char *this;
  ExecutionEngine e;
  Compiler c;
  ExecutionEngine local_2a;
  undefined1 local_29 [17];
  Value *local_18;
  
  this = "../Test.gs";
  Compiler::Compiler((Compiler *)local_29,"../Test.gs");
  Compiler::build((Program *)local_29,(Compiler *)this);
  Compiler::build((Program *)(local_29 + 1),(Compiler *)local_29);
  p.instr = (int *)local_29._9_8_;
  p.conSize = local_29._1_4_;
  p.inSize = local_29._5_4_;
  p.Consts = local_18;
  ExecutionEngine::ExecutionEngine(&local_2a,p);
  ExecutionEngine::run(&local_2a);
  return 0;
}

Assistant:

int main() {
  Program pt; 
  Compiler c("../Test.gs");
  c.build();
  pt = c.dump();

  ExecutionEngine e(pt);
  e.run();
}